

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

uchar testinator::detail::Arbitrary_Arithmetic_IntCast<unsigned_char>::generate
                (size_t generation,unsigned_long randomSeed)

{
  byte bVar1;
  byte bVar2;
  result_type_conflict rVar3;
  TestRegistry *this;
  uniform_int_distribution<int> local_30;
  uniform_int_distribution<int> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation == 0) {
    generation_local._7_1_ = '\0';
  }
  else if (generation == 1) {
    generation_local._7_1_ = ::std::numeric_limits<unsigned_char>::min();
  }
  else if (generation == 2) {
    generation_local._7_1_ = ::std::numeric_limits<unsigned_char>::max();
  }
  else {
    this = GetTestRegistry();
    dis._M_param = (param_type)TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)dis._M_param,randomSeed);
    bVar1 = ::std::numeric_limits<unsigned_char>::min();
    bVar2 = ::std::numeric_limits<unsigned_char>::max();
    ::std::uniform_int_distribution<int>::uniform_int_distribution(&local_30,bVar1 + 1,bVar2 - 1);
    rVar3 = ::std::uniform_int_distribution<int>::operator()
                      (&local_30,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)dis._M_param);
    generation_local._7_1_ = (uchar)rVar3;
  }
  return generation_local._7_1_;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<int> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return static_cast<T>(dis(gen));
          }
        }
      }